

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell_renderer.cpp
# Opt level: O1

void __thiscall
duckdb_shell::ModeLatexRenderer::RenderHeader(ModeLatexRenderer *this,ColumnarResult *result)

{
  ShellState *this_00;
  char *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  ulong uVar4;
  idx_t i;
  
  ShellState::Print((this->super_ColumnRenderer).super_ShellRenderer.state,"\\begin{tabular}{|");
  if (result->column_count != 0) {
    uVar4 = 0;
    do {
      bVar2 = ShellState::ColumnTypeIsInteger
                        ((this->super_ColumnRenderer).super_ShellRenderer.state,
                         (result->type_names).
                         super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar4]);
      pcVar1 = "+l";
      if (bVar2) {
        pcVar1 = "+r";
      }
      ShellState::Print((this->super_ColumnRenderer).super_ShellRenderer.state,pcVar1 + 1);
      uVar4 = uVar4 + 1;
    } while (uVar4 < result->column_count);
  }
  ShellState::Print((this->super_ColumnRenderer).super_ShellRenderer.state,"|}\n");
  ShellState::Print((this->super_ColumnRenderer).super_ShellRenderer.state,"\\hline\n");
  if (result->column_count != 0) {
    i = 0;
    do {
      ColumnRenderer::RenderAlignedValue(&this->super_ColumnRenderer,result,i);
      this_00 = (this->super_ColumnRenderer).super_ShellRenderer.state;
      iVar3 = (*(this->super_ColumnRenderer).super_ShellRenderer._vptr_ShellRenderer
                [(ulong)(i == result->column_count - 1) + 4])(this);
      ShellState::Print(this_00,(char *)CONCAT44(extraout_var,iVar3));
      i = i + 1;
    } while (i < result->column_count);
  }
  ShellState::Print((this->super_ColumnRenderer).super_ShellRenderer.state,"\\hline\n");
  return;
}

Assistant:

void RenderHeader(ColumnarResult &result) override {
		state.Print("\\begin{tabular}{|");
		for (idx_t i = 0; i < result.column_count; i++) {
			if (state.ColumnTypeIsInteger(result.type_names[i])) {
				state.Print("r");
			} else {
				state.Print("l");
			}
		}
		state.Print("|}\n");
		state.Print("\\hline\n");
		for (idx_t i = 0; i < result.column_count; i++) {
			RenderAlignedValue(result, i);
			state.Print(i == result.column_count - 1 ? GetRowSeparator() : GetColumnSeparator());
		}
		state.Print("\\hline\n");
	}